

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O1

int unzGetFilePos(unzFile file,unz_file_pos *file_pos)

{
  bool bVar1;
  int iVar2;
  uLong in_RCX;
  uLong in_RDX;
  
  if (file == (unzFile)0x0) {
    iVar2 = -0x66;
    bVar1 = false;
  }
  else {
    iVar2 = 0;
    if (*(long *)((long)file + 0x90) == 0) {
      iVar2 = -100;
      bVar1 = false;
    }
    else {
      in_RCX = *(uLong *)((long)file + 0x80);
      in_RDX = *(uLong *)((long)file + 0x88);
      bVar1 = true;
    }
  }
  if (bVar1) {
    file_pos->pos_in_zip_directory = in_RDX;
    file_pos->num_of_file = in_RCX;
  }
  return iVar2;
}

Assistant:

extern int ZEXPORT unzGetFilePos64(unzFile file, unz64_file_pos* file_pos)
{
    unz64_s* s;

    if (file == NULL || file_pos == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    if (!s->current_file_ok)
        return UNZ_END_OF_LIST_OF_FILE;

    file_pos->pos_in_zip_directory = s->pos_in_central_dir;
    file_pos->num_of_file = s->num_file;

    return UNZ_OK;
}